

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * sd2b(U *d,int scale,int *e)

{
  int iVar1;
  byte bVar2;
  Bigint *b;
  int *e_local;
  int scale_local;
  U *d_local;
  
  d_local = (U *)Balloc(1);
  if (d_local == (U *)0x0) {
    d_local = (U *)0x0;
  }
  else {
    *(int *)((long)d_local + 0x14) = 2;
    d_local[3].L[0] = d->L[0];
    *(uint32 *)((long)d_local + 0x1c) = d->L[1] & 0xfffff;
    *e = ((d->L[1] & 0x7ff00000) >> 0x14) - 0x433;
    if (*e < -0x432) {
      *e = -0x432;
    }
    else {
      *(uint *)((long)d_local + 0x1c) = *(uint *)((long)d_local + 0x1c) | 0x100000;
    }
    if ((scale != 0) &&
       (((d_local[3].L[0] != 0 || (*(int *)((long)d_local + 0x1c) != 0)) &&
        (*e = *e - scale, *e < -0x432)))) {
      iVar1 = *e;
      e_local._4_4_ = -iVar1 + -0x432;
      *e = -0x432;
      if ((e_local._4_4_ < 1) || (0x34 < e_local._4_4_)) {
        __assert_fail("0 < scale && scale <= P - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/dtoa.c"
                      ,0x452,"Bigint *sd2b(U *, int, int *)");
      }
      if (0x1f < e_local._4_4_) {
        if (d_local[3].L[0] != 0) {
          __assert_fail("b->x[0] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/dtoa.c"
                        ,0x455,"Bigint *sd2b(U *, int, int *)");
        }
        d_local[3].L[0] = *(uint32 *)((long)d_local + 0x1c);
        *(undefined4 *)((long)d_local + 0x1c) = 0;
        e_local._4_4_ = -iVar1 + -0x452;
      }
      if (e_local._4_4_ != 0) {
        bVar2 = (byte)e_local._4_4_;
        if (d_local[3].L[0] << (0x20 - bVar2 & 0x1f) != 0) {
          __assert_fail("b->x[0] << (32 - scale) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/dtoa.c"
                        ,0x45c,"Bigint *sd2b(U *, int, int *)");
        }
        d_local[3].L[0] =
             d_local[3].L[0] >> (bVar2 & 0x1f) |
             *(int *)((long)d_local + 0x1c) << (0x20 - bVar2 & 0x1f);
        *(uint *)((long)d_local + 0x1c) = *(uint *)((long)d_local + 0x1c) >> (bVar2 & 0x1f);
      }
    }
    if (*(int *)((long)d_local + 0x1c) == 0) {
      *(int *)((long)d_local + 0x14) = 1;
    }
  }
  return (Bigint *)d_local;
}

Assistant:

static Bigint *
sd2b(U *d, int scale, int *e)
{
    Bigint *b;

    b = Balloc(1);
    if (b == NULL)
        return NULL;
    
    /* First construct b and e assuming that scale == 0. */
    b->wds = 2;
    b->x[0] = word1(d);
    b->x[1] = word0(d) & Frac_mask;
    *e = Etiny - 1 + (int)((word0(d) & Exp_mask) >> Exp_shift);
    if (*e < Etiny)
        *e = Etiny;
    else
        b->x[1] |= Exp_msk1;

    /* Now adjust for scale, provided that b != 0. */
    if (scale && (b->x[0] || b->x[1])) {
        *e -= scale;
        if (*e < Etiny) {
            scale = Etiny - *e;
            *e = Etiny;
            /* We can't shift more than P-1 bits without shifting out a 1. */
            assert(0 < scale && scale <= P - 1);
            if (scale >= 32) {
                /* The bits shifted out should all be zero. */
                assert(b->x[0] == 0);
                b->x[0] = b->x[1];
                b->x[1] = 0;
                scale -= 32;
            }
            if (scale) {
                /* The bits shifted out should all be zero. */
                assert(b->x[0] << (32 - scale) == 0);
                b->x[0] = (b->x[0] >> scale) | (b->x[1] << (32 - scale));
                b->x[1] >>= scale;
            }
        }
    }
    /* Ensure b is normalized. */
    if (!b->x[1])
        b->wds = 1;

    return b;
}